

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIFT.cpp
# Opt level: O1

double calAngle(double tangentX,double tangentY)

{
  double dVar1;
  double dVar2;
  
  dVar2 = ABS(tangentX);
  dVar1 = 1e-08;
  if ((1e-08 <= dVar2) || (1e-08 <= ABS(tangentY))) {
    if ((1e-08 <= dVar2) || (tangentY <= 99999.0)) {
      if ((1e-08 <= dVar2) || (-99999.0 <= tangentY)) {
        dVar1 = atan(tangentY / tangentX);
        dVar1 = (dVar1 * 180.0) / 3.14159265;
        if (((tangentX < 0.0) && (tangentY < 0.0)) || ((tangentX < 0.0 && (0.0 < tangentY)))) {
          dVar1 = dVar1 + 180.0;
        }
      }
      else {
        dVar1 = 270.0;
      }
    }
    else {
      dVar1 = 90.0;
    }
  }
  return (double)(~-(ulong)(dVar1 < 0.0) & (ulong)dVar1 |
                 (ulong)(dVar1 + 360.0) & -(ulong)(dVar1 < 0.0));
}

Assistant:

double calAngle(double tangentX, double tangentY)
{
    double param = tangentY / double(tangentX);
    double tol = pow(10,-8);
    double angle;
    if(abs(tangentX - 0) < tol && abs(tangentY - 0) < tol)
        angle = tol;
    else if(abs(tangentX - 0) < tol && tangentY > 99999)
        angle = 90;
    else if(abs(tangentX - 0) < tol && tangentY < -99999)
        angle = 270;
    else{
        angle = atan(param) * 180 / PI;
        if(tangentX < 0 && tangentY < 0)
            angle += 180;
        else if(tangentX < 0 && tangentY > 0)
            angle += 180;
    }
    if(angle < 0)
        angle += 360;
    return angle;
}